

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Kernel * anon_unknown.dwarf_149389::SumKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  Kernel *pKVar1;
  value_type local_30;
  
  pKVar1 = (Kernel *)operator_new(0x60);
  pKVar1->_vptr_Kernel = (_func_int **)&PTR_process_0028fae0;
  std::__cxx11::string::string((string *)(pKVar1 + 1),(string *)def);
  pKVar1[5]._vptr_Kernel = (_func_int **)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(pKVar1 + 6),args);
  pKVar1[9]._vptr_Kernel = (_func_int **)0x0;
  pKVar1[10]._vptr_Kernel = (_func_int **)0x0;
  pKVar1[0xb]._vptr_Kernel = (_func_int **)0x0;
  local_30.m_node = (Node *)0x0;
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::_M_fill_assign
            ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)(pKVar1 + 9),
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_30);
  return pKVar1;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        return new SumKernel(def, args);
    }